

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.h
# Opt level: O0

int quicly_loss_on_alarm
              (quicly_loss_t *r,int64_t now,uint32_t max_ack_delay,int is_1rtt_only,
              size_t *min_packets_to_send,int *restrict_sending,
              quicly_loss_on_detect_cb on_loss_detected)

{
  long in_RDI;
  undefined8 *in_R8;
  undefined4 *in_R9;
  quicly_loss_on_detect_cb unaff_retaddr;
  undefined4 local_4;
  
  *(undefined8 *)(in_RDI + 0x58) = 0x7fffffffffffffff;
  *in_R8 = 1;
  if (*(long *)(in_RDI + 0x50) == 0x7fffffffffffffff) {
    *(char *)(in_RDI + 0x18) = *(char *)(in_RDI + 0x18) + '\x01';
    *in_R9 = 1;
    if ('\0' < *(char *)(in_RDI + 0x18)) {
      *in_R8 = 2;
    }
    local_4 = 0;
  }
  else {
    *in_R9 = 0;
    local_4 = quicly_loss_detect_loss
                        ((quicly_loss_t *)CONCAT44(max_ack_delay,is_1rtt_only),
                         (int64_t)min_packets_to_send,restrict_sending._4_4_,(int)restrict_sending,
                         unaff_retaddr);
  }
  return local_4;
}

Assistant:

inline int quicly_loss_on_alarm(quicly_loss_t *r, int64_t now, uint32_t max_ack_delay, int is_1rtt_only,
                                size_t *min_packets_to_send, int *restrict_sending, quicly_loss_on_detect_cb on_loss_detected)
{
    r->alarm_at = INT64_MAX;
    *min_packets_to_send = 1;
    if (r->loss_time != INT64_MAX) {
        /* Time threshold loss detection. Send at least 1 packet, but no restrictions on sending otherwise. */
        *restrict_sending = 0;
        return quicly_loss_detect_loss(r, now, max_ack_delay, is_1rtt_only, on_loss_detected);
    }
    /* PTO. Send at least and at most 1 packet during speculative probing and 2 packets otherwise. */
    ++r->pto_count;
    *restrict_sending = 1;
    if (r->pto_count > 0)
        *min_packets_to_send = 2;

    return 0;
}